

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack3_32(uint32_t *in,uint32_t *out)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar16 [16];
  undefined1 auVar15 [64];
  
  uVar1 = *(ulong *)(in + 1);
  auVar10 = vpmovsxbd_avx512f(_DAT_00184390);
  auVar11 = vpmovsxbd_avx512f(_DAT_001843a0);
  auVar8 = vpbroadcastd_avx512vl();
  auVar5 = vpsrlvd_avx2(auVar8,_DAT_0018cd80);
  auVar7 = vpbroadcastd_avx512vl();
  auVar2 = vpinsrd_avx(auVar7,*in,0);
  auVar3 = vpsrlvd_avx2(auVar7,_DAT_0018ff30);
  auVar7 = vpinsrd_avx(auVar2,(int)uVar1 * 4,1);
  auVar4 = vpsrlvd_avx2(auVar2,_DAT_0018ff20);
  auVar2._8_4_ = 4;
  auVar2._0_8_ = 0x400000004;
  auVar2._12_4_ = 4;
  auVar7 = vpandd_avx512vl(auVar7,auVar2);
  auVar10 = vpermi2d_avx512f(auVar10,ZEXT3264(auVar5),ZEXT3264(auVar8));
  auVar12 = vpbroadcastd_avx512f(ZEXT416(7));
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar1;
  auVar2 = vpshufd_avx(auVar16,0x50);
  auVar7 = vpblendd_avx2(auVar4,auVar7,2);
  auVar5 = vpermq_avx2(ZEXT1632(auVar2),0x40);
  auVar8 = vpsrlvd_avx2(auVar5,_DAT_0018cda0);
  auVar10 = vpermi2d_avx512f(auVar11,auVar10,ZEXT1664(auVar7));
  auVar11 = vpmovsxbq_avx512f(ZEXT816(0x806050403020100));
  auVar13 = vmovdqa64_avx512f(auVar10);
  auVar14 = vpbroadcastd_avx512f();
  auVar15._0_52_ = auVar13._0_52_;
  auVar15._52_4_ = auVar14._52_4_;
  auVar15._56_4_ = auVar13._56_4_;
  auVar15._60_4_ = auVar13._60_4_;
  auVar11 = vpermi2q_avx512f(auVar11,auVar15,ZEXT1664(auVar3));
  auVar5 = vpand_avx2(auVar8,auVar12._0_32_);
  auVar11 = vpandd_avx512f(auVar11,auVar12);
  auVar7 = vpbroadcastd_avx512vl();
  auVar2 = vpsrlvd_avx2(auVar7,_DAT_0018ff40);
  auVar7 = vpsrlvd_avx2(auVar7,_DAT_0018ff50);
  auVar2 = vpand_avx(auVar2,auVar12._0_16_);
  auVar7 = vpand_avx(auVar7,auVar12._0_16_);
  auVar13 = vpbroadcastd_avx512f();
  auVar14._0_40_ = auVar12._0_40_;
  auVar14._40_4_ = auVar13._40_4_;
  auVar14._44_4_ = auVar12._44_4_;
  auVar14._48_4_ = auVar12._48_4_;
  auVar14._52_4_ = auVar12._52_4_;
  auVar14._56_4_ = auVar12._56_4_;
  auVar14._60_4_ = auVar12._60_4_;
  auVar10 = vpord_avx512f(auVar10,auVar14);
  auVar12._0_40_ = auVar11._0_40_;
  auVar12._40_4_ = auVar10._40_4_;
  auVar12._44_4_ = auVar11._44_4_;
  auVar12._48_4_ = auVar11._48_4_;
  auVar12._52_4_ = auVar11._52_4_;
  auVar12._56_4_ = auVar11._56_4_;
  auVar12._60_4_ = auVar11._60_4_;
  auVar9 = vpbroadcastd_avx512vl();
  auVar10 = vmovdqu64_avx512f(auVar12);
  *(undefined1 (*) [64])out = auVar10;
  auVar8 = vpor_avx2(auVar8,auVar9);
  uVar6 = (uint)(uVar1 >> 0x20);
  auVar5 = vpblendd_avx2(auVar5,auVar8,0x20);
  *(undefined1 (*) [32])(out + 0x10) = auVar5;
  *(undefined1 (*) [16])(out + 0x18) = auVar2;
  *(long *)(out + 0x1c) = auVar7._0_8_;
  out[0x1e] = uVar6 >> 0x1a & 7;
  out[0x1f] = uVar6 >> 0x1d;
  return in + 3;
}

Assistant:

const uint32_t *__fastunpack3_32(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 3);
  out++;
  *out = ((*in) >> 3) % (1U << 3);
  out++;
  *out = ((*in) >> 6) % (1U << 3);
  out++;
  *out = ((*in) >> 9) % (1U << 3);
  out++;
  *out = ((*in) >> 12) % (1U << 3);
  out++;
  *out = ((*in) >> 15) % (1U << 3);
  out++;
  *out = ((*in) >> 18) % (1U << 3);
  out++;
  *out = ((*in) >> 21) % (1U << 3);
  out++;
  *out = ((*in) >> 24) % (1U << 3);
  out++;
  *out = ((*in) >> 27) % (1U << 3);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 1)) << (3 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 3);
  out++;
  *out = ((*in) >> 4) % (1U << 3);
  out++;
  *out = ((*in) >> 7) % (1U << 3);
  out++;
  *out = ((*in) >> 10) % (1U << 3);
  out++;
  *out = ((*in) >> 13) % (1U << 3);
  out++;
  *out = ((*in) >> 16) % (1U << 3);
  out++;
  *out = ((*in) >> 19) % (1U << 3);
  out++;
  *out = ((*in) >> 22) % (1U << 3);
  out++;
  *out = ((*in) >> 25) % (1U << 3);
  out++;
  *out = ((*in) >> 28) % (1U << 3);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 2)) << (3 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 3);
  out++;
  *out = ((*in) >> 5) % (1U << 3);
  out++;
  *out = ((*in) >> 8) % (1U << 3);
  out++;
  *out = ((*in) >> 11) % (1U << 3);
  out++;
  *out = ((*in) >> 14) % (1U << 3);
  out++;
  *out = ((*in) >> 17) % (1U << 3);
  out++;
  *out = ((*in) >> 20) % (1U << 3);
  out++;
  *out = ((*in) >> 23) % (1U << 3);
  out++;
  *out = ((*in) >> 26) % (1U << 3);
  out++;
  *out = ((*in) >> 29);
  ++in;
  out++;

  return in;
}